

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_wrapper.cc
# Opt level: O0

void __thiscall ipx::BasicLu::_BtranForUpdate(BasicLu *this,Int j)

{
  lu_int lVar1;
  logic_error *this_00;
  Int status;
  double *in_stack_00000220;
  lu_int *in_stack_00000228;
  double *in_stack_00000230;
  lu_int *in_stack_00000238;
  double *in_stack_00000240;
  lu_int *in_stack_00000248;
  lu_int *in_stack_00000260;
  double *in_stack_00000268;
  lu_int in_stack_00000270;
  lu_int *in_stack_00000278;
  double *in_stack_00000280;
  lu_int *in_stack_00000288;
  lu_int *in_stack_00000290;
  double *in_stack_00000298;
  char in_stack_000002a0;
  BasicLu *in_stack_ffffffffffffff90;
  
  while( true ) {
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x8098c8);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x8098de);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x8098f4);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x80990d);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x809923);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x80993c);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x809952);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x80996e);
    lVar1 = basiclu_solve_for_update
                      (in_stack_00000248,in_stack_00000240,in_stack_00000238,in_stack_00000230,
                       in_stack_00000228,in_stack_00000220,in_stack_00000260,in_stack_00000268,
                       in_stack_00000270,in_stack_00000278,in_stack_00000280,in_stack_00000288,
                       in_stack_00000290,in_stack_00000298,in_stack_000002a0);
    if (lVar1 != 1) break;
    Reallocate(in_stack_ffffffffffffff90);
  }
  if (lVar1 != 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"basiclu_solve_for_update (btran without lhs) failed");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void BasicLu::_BtranForUpdate(Int j) {
    Int status;
    for (;;) {
        status = basiclu_solve_for_update(istore_.data(), xstore_.data(),
                                          Li_.data(), Lx_.data(),
                                          Ui_.data(), Ux_.data(),
                                          Wi_.data(), Wx_.data(),
                                          0, &j, nullptr,
                                          nullptr, nullptr, nullptr, 'T');
        if (status != BASICLU_REALLOCATE)
            break;
        Reallocate();
    }
    if (status != BASICLU_OK)
        throw std::logic_error(
            "basiclu_solve_for_update (btran without lhs) failed");
}